

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O2

void __thiscall bal::GraphMLStreamWriter::write_header(GraphMLStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,
                           "<?xml version=\"1.0\" encoding=\"UTF-8\"?>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,
                           "<graphml xmlns=\"http://graphml.graphdrawing.org/xmlns\" xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\" xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://graphml.graphdrawing.org/xmlns/1.0/graphml.xsd\">"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,
                           "<graph id=\"CNF\" edgedefault=\"undirected\">");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,
                           "<key id=\"n_variable_name\" for=\"node\" attr.name=\"variable_name\" attr.type=\"string\"/>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,
                           "<key id=\"n_variable_index\" for=\"node\" attr.name=\"variable_index\" attr.type=\"int\"/>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,
                           "<key id=\"n_variable_id\" for=\"node\" attr.name=\"variable_id\" attr.type=\"int\"/>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_StreamWriter<bal::Cnf>).stream_,
                           "<key id=\"n_label\" for=\"node\" attr.name=\"label\" attr.type=\"string\"/>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

virtual void write_header(const Cnf& value) {
            stream() << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>" << std::endl;
            stream() << "<graphml xmlns=\"http://graphml.graphdrawing.org/xmlns\" xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\" xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://graphml.graphdrawing.org/xmlns/1.0/graphml.xsd\">" << std::endl;
            stream() << "<graph id=\"CNF\" edgedefault=\"undirected\">" << std::endl;
            stream() << "<key id=\"n_variable_name\" for=\"node\" attr.name=\"variable_name\" attr.type=\"string\"/>" << std::endl;
            stream() << "<key id=\"n_variable_index\" for=\"node\" attr.name=\"variable_index\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"n_variable_id\" for=\"node\" attr.name=\"variable_id\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"n_label\" for=\"node\" attr.name=\"label\" attr.type=\"string\"/>" << std::endl;
        }